

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O2

bool __thiscall CNetAddr::IsValid(CNetAddr *this)

{
  uint uVar1;
  long lVar2;
  bool bVar3;
  CNetAddr *pCVar4;
  long in_FS_OFFSET;
  undefined1 auVar5 [16];
  uchar ipNone6 [16];
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_net == NET_CJDNS) {
    pCVar4 = this;
    if (0x10 < (this->m_addr)._size) {
      pCVar4 = (CNetAddr *)(this->m_addr)._union.indirect_contents.indirect;
    }
    if ((pCVar4->m_addr)._union.direct[0] == -4) goto LAB_005965bd;
  }
  else {
    if (this->m_net == NET_IPV6) {
      pCVar4 = this;
      if (0x10 < (this->m_addr)._size) {
        pCVar4 = (CNetAddr *)(this->m_addr)._union.indirect_contents.indirect;
      }
      auVar5[0] = -((pCVar4->m_addr)._union.direct[0] == '\0');
      auVar5[1] = -((pCVar4->m_addr)._union.direct[1] == '\0');
      auVar5[2] = -((pCVar4->m_addr)._union.direct[2] == '\0');
      auVar5[3] = -((pCVar4->m_addr)._union.direct[3] == '\0');
      auVar5[4] = -((pCVar4->m_addr)._union.direct[4] == '\0');
      auVar5[5] = -((pCVar4->m_addr)._union.direct[5] == '\0');
      auVar5[6] = -((pCVar4->m_addr)._union.direct[6] == '\0');
      auVar5[7] = -((pCVar4->m_addr)._union.direct[7] == '\0');
      auVar5[8] = -((pCVar4->m_addr)._union.direct[8] == '\0');
      auVar5[9] = -((pCVar4->m_addr)._union.direct[9] == '\0');
      auVar5[10] = -((pCVar4->m_addr)._union.direct[10] == '\0');
      auVar5[0xb] = -((pCVar4->m_addr)._union.direct[0xb] == '\0');
      auVar5[0xc] = -((pCVar4->m_addr)._union.direct[0xc] == '\0');
      auVar5[0xd] = -((pCVar4->m_addr)._union.direct[0xd] == '\0');
      auVar5[0xe] = -((pCVar4->m_addr)._union.direct[0xe] == '\0');
      auVar5[0xf] = -((pCVar4->m_addr)._union.direct[0xf] == '\0');
      if ((ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) | (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB161(auVar5 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar5 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar5 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar5 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar5 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar5 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar5 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar5 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar5 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar5 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar5 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar5 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar5 >> 0x77,0) & 1) << 0xe | (ushort)(auVar5[0xf] >> 7) << 0xf
                  ) == 0xffff) goto LAB_005965ee;
    }
LAB_005965bd:
    bVar3 = IsRFC3849(this);
    if ((!bVar3) && (this->m_net != NET_INTERNAL)) {
      if (this->m_net == NET_IPV4) {
        if (0x10 < (this->m_addr)._size) {
          this = (CNetAddr *)(this->m_addr)._union.indirect_contents.indirect;
        }
        uVar1 = *(uint *)&(this->m_addr)._union;
        if (0xfffffffd <
            (uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18) - 1)
        goto LAB_005965ee;
      }
      bVar3 = true;
      goto LAB_005965f0;
    }
  }
LAB_005965ee:
  bVar3 = false;
LAB_005965f0:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool CNetAddr::IsValid() const
{
    // unspecified IPv6 address (::/128)
    unsigned char ipNone6[16] = {};
    if (IsIPv6() && memcmp(m_addr.data(), ipNone6, sizeof(ipNone6)) == 0) {
        return false;
    }

    if (IsCJDNS() && !HasCJDNSPrefix()) {
        return false;
    }

    // documentation IPv6 address
    if (IsRFC3849())
        return false;

    if (IsInternal())
        return false;

    if (IsIPv4()) {
        const uint32_t addr = ReadBE32(m_addr.data());
        if (addr == INADDR_ANY || addr == INADDR_NONE) {
            return false;
        }
    }

    return true;
}